

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chapter_11.cpp
# Opt level: O0

void file_open_err(string *filename,FileType type)

{
  char *local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  FileType local_14;
  string *psStack_10;
  FileType type_local;
  string *filename_local;
  
  local_14 = type;
  psStack_10 = filename;
  std::operator+(&local_78,"Could not open \'",filename);
  std::operator+(&local_58,&local_78,"\' for ");
  if (local_14 == in) {
    local_98 = "reading";
  }
  else {
    local_98 = "writing";
  }
  std::operator+(&local_38,&local_58,local_98);
  error(&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  return;
}

Assistant:

void file_open_err(const std::string& filename, FileType type)
{
	error("Could not open '"
		+ filename
		+ "' for "
		+ (type == FileType::in ? "reading" : "writing"));
}